

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::Configurations::Parser::ignoreComments(string *line)

{
  char *pcVar1;
  string *in_RDI;
  bool bVar2;
  size_t quotesEnd;
  size_t quotesStart;
  size_t foundAt;
  string local_40 [32];
  ulong local_20;
  long local_18;
  ulong local_10;
  string *local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  local_18 = std::__cxx11::string::find((char *)in_RDI,0x26879f);
  local_20 = 0xffffffffffffffff;
  if (local_18 != -1) {
    local_20 = std::__cxx11::string::find((char *)local_8,0x26879f);
    while( true ) {
      bVar2 = false;
      if (local_20 != 0xffffffffffffffff) {
        pcVar1 = (char *)std::__cxx11::string::at((ulong)local_8);
        bVar2 = *pcVar1 == '\\';
      }
      if (!bVar2) break;
      local_20 = std::__cxx11::string::find((char *)local_8,0x26879f);
    }
  }
  local_10 = std::__cxx11::string::find
                       ((char *)local_8,(ulong)el::base::consts::kConfigurationComment);
  if (local_10 != 0xffffffffffffffff) {
    if (local_10 < local_20) {
      local_10 = std::__cxx11::string::find
                           ((char *)local_8,(ulong)el::base::consts::kConfigurationComment);
    }
    std::__cxx11::string::substr((ulong)local_40,(ulong)local_8);
    std::__cxx11::string::operator=(local_8,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void Configurations::Parser::ignoreComments(std::string* line) {
  std::size_t foundAt = 0;
  std::size_t quotesStart = line->find("\"");
  std::size_t quotesEnd = std::string::npos;
  if (quotesStart != std::string::npos) {
    quotesEnd = line->find("\"", quotesStart + 1);
    while (quotesEnd != std::string::npos && line->at(quotesEnd - 1) == '\\') {
      // Do not erase slash yet - we will erase it in parseLine(..) while loop
      quotesEnd = line->find("\"", quotesEnd + 2);
    }
  }
  if ((foundAt = line->find(base::consts::kConfigurationComment)) != std::string::npos) {
    if (foundAt < quotesEnd) {
      foundAt = line->find(base::consts::kConfigurationComment, quotesEnd + 1);
    }
    *line = line->substr(0, foundAt);
  }
}